

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::accessChainStore
          (TGlslangToSpvTraverser *this,TType *type,Id rvalue)

{
  Builder *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x_00;
  Op OVar1;
  Instruction *pIVar2;
  undefined8 uVar3;
  int iVar4;
  Id IVar5;
  Id IVar6;
  Id IVar7;
  CoherentFlags CVar8;
  uint uVar9;
  Decoration nonUniform;
  MemoryAccessMask MVar10;
  Scope scope;
  TType *type_00;
  CoherentFlags coherentFlags;
  Id local_a0;
  CoherentFlags local_9c;
  Builder *local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  CoherentFlags local_88 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  Id local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  CoherentFlags local_38 [2];
  
  iVar4 = (*type->_vptr_TType[7])(type);
  local_a0 = rvalue;
  if (iVar4 != 0xc) goto LAB_003bf7c9;
  this_00 = &this->builder;
  IVar5 = spv::Builder::accessChainGetInferredType(this_00);
  OVar1 = (this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[IVar5]->opCode;
  if (OVar1 - OpTypeBool < 3) {
    IVar6 = spv::Builder::makeBoolType(this_00);
    if (IVar5 != IVar6) {
      IVar6 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(this_00,IVar6,1,false);
      IVar7 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar7 = spv::Builder::makeIntConstant(this_00,IVar7,0,false);
LAB_003bf739:
      local_a0 = spv::Builder::createTriOp(this_00,OpSelect,IVar5,rvalue,IVar6,IVar7);
      goto LAB_003bf7c9;
    }
    pIVar2 = (this->builder).module.idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[rvalue];
    if (pIVar2 == (Instruction *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = pIVar2->typeId;
    }
    if (IVar5 == IVar6) goto LAB_003bf7c9;
    IVar5 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar5 = spv::Builder::makeIntConstant(this_00,IVar5,0,false);
  }
  else {
    if (OVar1 != OpTypeVector) goto LAB_003bf7c9;
    uVar9 = spv::Builder::getNumTypeConstituents(this_00,IVar5);
    IVar6 = spv::Builder::makeBoolType(this_00);
    IVar6 = spv::Builder::makeVectorType(this_00,IVar6,uVar9);
    if (IVar5 != IVar6) {
      IVar6 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(this_00,IVar6,1,false);
      IVar6 = makeSmearedConstant(this,IVar6,uVar9);
      IVar7 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar7 = spv::Builder::makeIntConstant(this_00,IVar7,0,false);
      IVar7 = makeSmearedConstant(this,IVar7,uVar9);
      goto LAB_003bf739;
    }
    pIVar2 = (this->builder).module.idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[rvalue];
    if (pIVar2 == (Instruction *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = pIVar2->typeId;
    }
    if (IVar5 == IVar6) goto LAB_003bf7c9;
    IVar5 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar5 = spv::Builder::makeIntConstant(this_00,IVar5,0,false);
    IVar5 = makeSmearedConstant(this,IVar5,uVar9);
  }
  local_a0 = spv::Builder::createBinOp(this_00,OpINotEqual,IVar6,rvalue,IVar5);
LAB_003bf7c9:
  local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
  __x = &(this->builder).accessChain.indexChain;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,__x);
  local_68 = (this->builder).accessChain.instr;
  __x_00 = &(this->builder).accessChain.swizzle;
  type_00 = (TType *)__x_00;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__x_00);
  local_38[0]._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
  local_48._0_4_ = (this->builder).accessChain.component;
  local_48._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
  uStack_40._0_1_ = (this->builder).accessChain.isRValue;
  uStack_40._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
  uStack_40._4_4_ = (this->builder).accessChain.alignment;
  local_9c = local_38[0];
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    type_00 = (TType *)((long)local_60.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_60.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,(ulong)type_00);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    type_00 = (TType *)((long)local_80.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_80.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,(ulong)type_00);
  }
  CVar8 = TranslateCoherent((TGlslangToSpvTraverser *)type,type_00);
  local_88[0]._0_2_ = CVar8._0_2_;
  spv::Builder::AccessChain::CoherentFlags::operator|=(&local_9c,local_88);
  local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
  local_90 = __x;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,__x);
  local_68 = (this->builder).accessChain.instr;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__x_00);
  local_48._0_4_ = (this->builder).accessChain.component;
  local_48._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
  uVar3._0_1_ = (this->builder).accessChain.isRValue;
  uVar3._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
  uVar3._4_4_ = (this->builder).accessChain.alignment;
  local_38[0]._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
  uStack_40 = uVar3;
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_98 = &this->builder;
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  uVar9 = glslang::TType::getBufferReferenceAlignment(type);
  local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,local_90);
  local_68 = (this->builder).accessChain.instr;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__x_00);
  local_38[0]._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
  local_48._0_4_ = (this->builder).accessChain.component;
  local_48._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
  uStack_40._0_1_ = (this->builder).accessChain.isRValue;
  uStack_40._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
  uStack_40._4_4_ = (this->builder).accessChain.alignment;
  nonUniform = TranslateNonUniformDecoration(this,local_38);
  MVar10 = TranslateMemoryAccess(this,&local_9c);
  scope = TranslateMemoryScope(this,&local_9c);
  spv::Builder::accessChainStore
            (local_98,local_a0,nonUniform,MVar10 & ~MakePointerVisible,scope,uVar3._4_4_ | uVar9);
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::accessChainStore(const glslang::TType& type, spv::Id rvalue)
{
    // Need to convert to abstract types when necessary
    if (type.getBasicType() == glslang::EbtBool) {
        spv::Id nominalTypeId = builder.accessChainGetInferredType();

        if (builder.isScalarType(nominalTypeId)) {
            // Conversion for bool
            spv::Id boolType = builder.makeBoolType();
            if (nominalTypeId != boolType) {
                // keep these outside arguments, for determinant order-of-evaluation
                spv::Id one = builder.makeUintConstant(1);
                spv::Id zero = builder.makeUintConstant(0);
                rvalue = builder.createTriOp(spv::OpSelect, nominalTypeId, rvalue, one, zero);
            } else if (builder.getTypeId(rvalue) != boolType)
                rvalue = builder.createBinOp(spv::OpINotEqual, boolType, rvalue, builder.makeUintConstant(0));
        } else if (builder.isVectorType(nominalTypeId)) {
            // Conversion for bvec
            int vecSize = builder.getNumTypeComponents(nominalTypeId);
            spv::Id bvecType = builder.makeVectorType(builder.makeBoolType(), vecSize);
            if (nominalTypeId != bvecType) {
                // keep these outside arguments, for determinant order-of-evaluation
                spv::Id one = makeSmearedConstant(builder.makeUintConstant(1), vecSize);
                spv::Id zero = makeSmearedConstant(builder.makeUintConstant(0), vecSize);
                rvalue = builder.createTriOp(spv::OpSelect, nominalTypeId, rvalue, one, zero);
            } else if (builder.getTypeId(rvalue) != bvecType)
                rvalue = builder.createBinOp(spv::OpINotEqual, bvecType, rvalue,
                                             makeSmearedConstant(builder.makeUintConstant(0), vecSize));
        }
    }

    spv::Builder::AccessChain::CoherentFlags coherentFlags = builder.getAccessChain().coherentFlags;
    coherentFlags |= TranslateCoherent(type);

    unsigned int alignment = builder.getAccessChain().alignment;
    alignment |= type.getBufferReferenceAlignment();

    builder.accessChainStore(rvalue, TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags),
                             spv::MemoryAccessMask(TranslateMemoryAccess(coherentFlags) &
                                ~spv::MemoryAccessMakePointerVisibleKHRMask),
                             TranslateMemoryScope(coherentFlags), alignment);
}